

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toPlainString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  int iVar3;
  uint uVar4;
  byte bVar5;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e5ab8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  uStack_38 = in_RAX;
  if ((this->flags & 1U) != 0) {
    uStack_38._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_38._0_4_ = (undefined4)in_RAX;
    uStack_38._0_6_ = CONCAT24(0x2d,(undefined4)uStack_38);
    UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 4),0,1);
  }
  iVar1 = this->precision;
  if ((iVar1 == 0) || (iVar3 = this->scale, iVar1 + iVar3 + -1 < 0)) {
    uStack_38 = CONCAT26(0x30,(undefined6)uStack_38);
    UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 6),0,1);
    iVar3 = this->scale;
    iVar1 = this->precision;
  }
  iVar1 = iVar1 + iVar3;
  iVar3 = this->lOptPos;
  if (iVar1 <= this->lOptPos) {
    iVar3 = iVar1;
  }
  if (iVar1 < this->lReqPos) {
    iVar3 = this->lReqPos;
  }
  iVar1 = iVar3 * 4;
  while( true ) {
    iVar1 = iVar1 + -4;
    uVar2 = this->scale;
    uVar4 = this->rOptPos;
    if (this->rOptPos <= (int)uVar2) {
      uVar4 = uVar2;
    }
    if (this->rReqPos < (int)uVar2) {
      uVar4 = this->rReqPos;
    }
    if (iVar3 <= (int)uVar4) break;
    if (iVar3 == 0) {
      uStack_38._0_4_ = CONCAT22(0x2e,(undefined2)uStack_38);
      UnicodeString::doAppend(__return_storage_ptr__,(UChar *)((long)&uStack_38 + 2),0,1);
      uVar2 = this->scale;
    }
    uVar4 = ~uVar2 + iVar3;
    if (this->usingBytes == true) {
      bVar5 = 0;
      if ((-1 < (int)uVar4) && (bVar5 = 0, (int)uVar4 < this->precision)) {
        bVar5 = (this->fBCD).bcdBytes.ptr[uVar4];
      }
    }
    else if (uVar4 < 0x10) {
      bVar5 = (byte)((this->fBCD).bcdLong >> ((char)iVar1 - (char)(uVar2 << 2) & 0x3fU)) & 0xf;
    }
    else {
      bVar5 = 0;
    }
    UnicodeString::append(__return_storage_ptr__,(char)bVar5 + 0x30);
    iVar3 = iVar3 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toPlainString() const {
    U_ASSERT(!isApproximate);
    UnicodeString sb;
    if (isNegative()) {
        sb.append(u'-');
    }
    if (precision == 0 || getMagnitude() < 0) {
        sb.append(u'0');
    }
    for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
        if (m == -1) { sb.append(u'.'); }
        sb.append(getDigit(m) + u'0');
    }
    return sb;
}